

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

void __thiscall doctest::Context::Context(Context *this,int argc,char **argv)

{
  ContextState *this_00;
  String SStack_38;
  
  this_00 = (ContextState *)operator_new(0x1168);
  detail::ContextState::ContextState(this_00);
  this->p = this_00;
  parseArgs(this,argc,argv,true);
  if (argc != 0) {
    String::String(&SStack_38,*argv);
    String::operator=(&(this->p->super_ContextOptions).binary_name,&SStack_38);
    String::~String(&SStack_38);
  }
  return;
}

Assistant:

Context::Context(int argc, const char* const* argv)
        : p(new detail::ContextState) {
    parseArgs(argc, argv, true);
    if(argc)
        p->binary_name = argv[0];
}